

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonalstructmatrix.cpp
# Opt level: O2

TPZMatrix<double> * __thiscall
TPZSparseBlockDiagonalStructMatrix<double,_TPZStructMatrixOR<double>_>::Create
          (TPZSparseBlockDiagonalStructMatrix<double,_TPZStructMatrixOR<double>_> *this)

{
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/tpzsparseblockdiagonalstructmatrix.cpp"
             ,0x21);
}

Assistant:

TPZMatrix<TVar> * TPZSparseBlockDiagonalStructMatrix<TVar,TPar>::Create()
{
	//extract the structure of the matrix from the mesh
	//create an object of type SparseBlockDiagonal
	
	// now, the values of the matrix cannot be initialized till the 
	// global matrix has been assembled
	// what about colors and overlapping techniques?
	
	// we need to create a structure which contains a vector of these
	// somehow creating solvers and matrix objects need to interact
	// a non overlapping preconditioner is a sequence solver
	// an overlapping preconditioner is a step solver
	// this preconditioner type should be created by the analysis class
	// it is too complicated to require the user to coordinate this within
	// the current class structure....
	DebugStop();
	return nullptr;
}